

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::LeaveEvent,QWindow*>(QWindow *args)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  QWindow *in_RDI;
  long in_FS_OFFSET;
  LeaveEvent event;
  undefined4 in_stack_ffffffffffffffb8;
  ProcessEventsFlag in_stack_ffffffffffffffbc;
  bool local_35;
  undefined1 local_30 [8];
  WindowSystemEvent *in_stack_ffffffffffffffd8;
  byte local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QThread::isMainThread();
  if ((uVar3 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::LeaveEvent,QWindow*>(in_RDI);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_RDI,in_stack_ffffffffffffffbc);
    local_35 = QWindowSystemInterface::flushWindowSystemEvents
                         (event.super_WindowSystemEvent._vptr_WindowSystemEvent._4_4_);
    goto LAB_00448f10;
  }
  memset(local_30,0xaa,0x28);
  QWindowSystemInterfacePrivate::LeaveEvent::LeaveEvent
            ((LeaveEvent *)in_RDI,
             (QWindow *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(in_stack_ffffffffffffffd8);
LAB_00448ecd:
    local_35 = (bool)(local_20 & 1);
  }
  else {
    uVar2 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_30);
    if ((uVar2 & 1) != 0) goto LAB_00448ecd;
    local_35 = false;
  }
  QWindowSystemInterfacePrivate::LeaveEvent::~LeaveEvent((LeaveEvent *)in_RDI);
LAB_00448f10:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_35;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}